

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

string * __thiscall
t_java_generator::inner_enum_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *ttype)

{
  long lVar1;
  int iVar2;
  t_type *ptVar3;
  long *plVar4;
  size_type *psVar5;
  string local_38;
  
  ptVar3 = t_type::get_true_type(ttype);
  iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0x10])(ptVar3);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xf])(ptVar3);
    if ((char)iVar2 == '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    ptVar3 = t_type::get_true_type(*(t_type **)&ptVar3[1].super_t_doc.has_doc_);
    type_name_abi_cxx11_(&local_38,this,ptVar3,true,false,false,false);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  }
  else {
    ptVar3 = t_type::get_true_type(*(t_type **)&ptVar3[1].super_t_doc.has_doc_);
    type_name_abi_cxx11_(&local_38,this,ptVar3,true,false,false,false);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string inner_enum_type_name(t_type* ttype) {
    ttype = get_true_type(ttype);
    if (ttype->is_map()) {
      t_map* tmap = (t_map*)ttype;
      t_type* key_type = get_true_type(tmap->get_key_type());
      return type_name(key_type, true) + ".class";
    } else if (ttype->is_set()) {
      t_set* tset = (t_set*)ttype;
      t_type* elem_type = get_true_type(tset->get_elem_type());
      return type_name(elem_type, true) + ".class";
    }
    return "";
  }